

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::ProfileBegin(ScriptContext *this,Phase phase)

{
  ScriptContextProfiler *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Phase phase_local;
  ScriptContext *this_local;
  
  pSVar1 = this->profiler;
  bVar3 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,ProfileFlag);
  if ((pSVar1 != (ScriptContextProfiler *)0x0) != bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xca0,
                                "((this->profiler != nullptr) == Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag))"
                                ,"Profiler tag is supplied but the profiler pointer is NULL");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->profiler != (ScriptContextProfiler *)0x0) {
    if ((this->ensureParentInfo & 1U) != 0) {
      (*this->hostScriptContext->_vptr_HostScriptContext[0x19])(this->hostScriptContext,0);
      this->ensureParentInfo = false;
    }
    ScriptContextProfiler::ProfileBegin(this->profiler,phase);
  }
  return;
}

Assistant:

void
        ScriptContext::ProfileBegin(Js::Phase phase)
    {
            AssertMsg((this->profiler != nullptr) == Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag),
                "Profiler tag is supplied but the profiler pointer is NULL");
            if (this->profiler)
            {
                if (this->ensureParentInfo)
                {
                    this->hostScriptContext->EnsureParentInfo();
                    this->ensureParentInfo = false;
                }
                this->profiler->ProfileBegin(phase);
            }
    }